

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetLocalizedGMTPattern
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UBool param_3,int32_t *parsedLen)

{
  int8_t iVar1;
  int local_44;
  int32_t local_38;
  char local_31;
  int32_t len;
  int32_t iStack_2c;
  UBool parsed;
  int32_t offset;
  int32_t idx;
  int32_t *parsedLen_local;
  UBool param_3_local;
  UnicodeString *pUStack_18;
  int32_t start_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  len = 0;
  local_31 = '\0';
  iStack_2c = start;
  _offset = parsedLen;
  parsedLen_local._3_1_ = param_3;
  parsedLen_local._4_4_ = start;
  pUStack_18 = text;
  text_local = (UnicodeString *)this;
  local_38 = UnicodeString::length(&this->fGMTPatternPrefix);
  if ((local_38 < 1) ||
     (iVar1 = UnicodeString::caseCompare(pUStack_18,iStack_2c,local_38,&this->fGMTPatternPrefix,0),
     iVar1 == '\0')) {
    iStack_2c = local_38 + iStack_2c;
    len = parseOffsetFields(this,pUStack_18,iStack_2c,'\0',&local_38);
    if (local_38 != 0) {
      iStack_2c = local_38 + iStack_2c;
      local_38 = UnicodeString::length(&this->fGMTPatternSuffix);
      if ((local_38 < 1) ||
         (iVar1 = UnicodeString::caseCompare
                            (pUStack_18,iStack_2c,local_38,&this->fGMTPatternSuffix,0),
         iVar1 == '\0')) {
        iStack_2c = local_38 + iStack_2c;
        local_31 = '\x01';
      }
    }
  }
  if (local_31 == '\0') {
    local_44 = 0;
  }
  else {
    local_44 = iStack_2c - parsedLen_local._4_4_;
  }
  *_offset = local_44;
  return len;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetLocalizedGMTPattern(const UnicodeString& text, int32_t start, UBool /*isShort*/, int32_t& parsedLen) const {
    int32_t idx = start;
    int32_t offset = 0;
    UBool parsed = FALSE;

    do {
        // Prefix part
        int32_t len = fGMTPatternPrefix.length();
        if (len > 0 && text.caseCompare(idx, len, fGMTPatternPrefix, 0) != 0) {
            // prefix match failed
            break;
        }
        idx += len;

        // Offset part
        offset = parseOffsetFields(text, idx, FALSE, len);
        if (len == 0) {
            // offset field match failed
            break;
        }
        idx += len;

        len = fGMTPatternSuffix.length();
        if (len > 0 && text.caseCompare(idx, len, fGMTPatternSuffix, 0) != 0) {
            // no suffix match
            break;
        }
        idx += len;
        parsed = TRUE;
    } while (FALSE);

    parsedLen = parsed ? idx - start : 0;
    return offset;
}